

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_append_index
          (CompilerGLSL *this,string *expr,uint32_t param_2,SPIRType *param_3,AccessChainFlags flags
          ,bool *access_chain_is_arrayed,uint32_t index)

{
  undefined1 local_138 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  string local_b8 [8];
  string expr_back;
  string local_88 [8];
  string expr_front;
  size_t split_pos;
  string idx_expr;
  bool register_expression_read;
  bool ptr_chain;
  bool index_is_literal;
  bool *access_chain_is_arrayed_local;
  AccessChainFlags flags_local;
  SPIRType *param_3_local;
  uint32_t param_2_local;
  string *expr_local;
  CompilerGLSL *this_local;
  
  if ((flags & 1) == 0) {
    to_unpacked_expression_abi_cxx11_((CompilerGLSL *)&split_pos,(uint32_t)this,SUB41(index,0));
  }
  else {
    convert_to_string<unsigned_int,_0>((spirv_cross *)&split_pos,&index);
  }
  if (((flags & 4) == 0) || ((*access_chain_is_arrayed & 1U) == 0)) {
    ::std::__cxx11::string::operator+=((string *)expr,"[");
    ::std::__cxx11::string::operator+=((string *)expr,(string *)&split_pos);
    ::std::__cxx11::string::operator+=((string *)expr,"]");
  }
  else {
    ::std::__cxx11::string::find_last_of((char)expr,0x5d);
    ::std::__cxx11::string::substr((ulong)local_88,(ulong)expr);
    ::std::__cxx11::string::substr((ulong)local_b8,(ulong)expr);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_138 + 0x20),(char *)local_88);
    enclose_expression((CompilerGLSL *)local_138,(string *)this);
    ::std::operator+(local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_138 + 0x20));
    ::std::operator+(local_d8,local_f8);
    ::std::__cxx11::string::operator=((string *)expr,(string *)local_d8);
    ::std::__cxx11::string::~string((string *)local_d8);
    ::std::__cxx11::string::~string((string *)local_f8);
    ::std::__cxx11::string::~string((string *)local_138);
    ::std::__cxx11::string::~string((string *)(local_138 + 0x20));
    ::std::__cxx11::string::~string(local_b8);
    ::std::__cxx11::string::~string(local_88);
  }
  ::std::__cxx11::string::~string((string *)&split_pos);
  return;
}

Assistant:

void CompilerGLSL::access_chain_internal_append_index(std::string &expr, uint32_t /*base*/, const SPIRType * /*type*/,
                                                      AccessChainFlags flags, bool &access_chain_is_arrayed,
                                                      uint32_t index)
{
	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;

	string idx_expr = index_is_literal ? convert_to_string(index) : to_unpacked_expression(index, register_expression_read);

	// For the case where the base of an OpPtrAccessChain already ends in [n],
	// we need to use the index as an offset to the existing index, otherwise,
	// we can just use the index directly.
	if (ptr_chain && access_chain_is_arrayed)
	{
		size_t split_pos = expr.find_last_of(']');
		string expr_front = expr.substr(0, split_pos);
		string expr_back = expr.substr(split_pos);
		expr = expr_front + " + " +  enclose_expression(idx_expr) + expr_back;
	}
	else
	{
		expr += "[";
		expr += idx_expr;
		expr += "]";
	}
}